

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::ZNames::ZNamesLoader::loadNames
          (ZNamesLoader *this,UResourceBundle *zoneStrings,char *key,UErrorCode *errorCode)

{
  uint in_EAX;
  UErrorCode localStatus;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  this->names[4] = (UChar *)0x0;
  this->names[5] = (UChar *)0x0;
  this->names[2] = (UChar *)0x0;
  this->names[3] = (UChar *)0x0;
  this->names[0] = (UChar *)0x0;
  this->names[1] = (UChar *)0x0;
  this->names[6] = (UChar *)0x0;
  ures_getAllItemsWithFallback_63
            (zoneStrings,key,&this->super_ResourceSink,(UErrorCode *)((long)&uStack_18 + 4));
  if (uStack_18._4_4_ < U_ILLEGAL_ARGUMENT_ERROR) {
    *errorCode = uStack_18._4_4_;
  }
  return;
}

Assistant:

void loadNames(const UResourceBundle* zoneStrings, const char* key, UErrorCode& errorCode) {
        U_ASSERT(zoneStrings != NULL);
        U_ASSERT(key != NULL);
        U_ASSERT(key[0] != '\0');

        UErrorCode localStatus = U_ZERO_ERROR;
        clear();
        ures_getAllItemsWithFallback(zoneStrings, key, *this, localStatus);

        // Ignore errors, but propogate possible warnings.
        if (U_SUCCESS(localStatus)) {
            errorCode = localStatus;
        }
    }